

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::deal_phi(Codegen *this,PhiInst *phi)

{
  bool bVar1;
  ostream *poVar2;
  Codegen *this_00;
  VarId *tgt;
  Function *pFVar3;
  long in_RSI;
  VarId *x;
  iterator __end2;
  iterator __begin2;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range2;
  VarId dest;
  VarId *in_stack_fffffffffffffbc8;
  Function *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  string *name;
  Function *in_stack_fffffffffffffbe0;
  Function *this_01;
  Function *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  VarId *item;
  Timestamp *in_stack_fffffffffffffc58;
  Timestamp *timestamp;
  ostream *in_stack_fffffffffffffc60;
  ostream *os;
  undefined1 local_369 [40];
  allocator<char> local_341;
  string local_340 [8];
  Severity *in_stack_fffffffffffffcc8;
  ostream *in_stack_fffffffffffffcd0;
  time_point_sys_clock local_2c8;
  Timestamp local_2c0;
  Function local_2a8;
  allocator<char> local_249;
  string local_248 [39];
  undefined1 local_221 [121];
  time_point_sys_clock local_1a8;
  Timestamp local_1a0 [3];
  undefined1 local_151;
  reference local_150;
  VarId *local_148;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  local_140;
  long local_138;
  undefined1 local_129 [40];
  ostream local_101;
  string local_100 [120];
  time_point_sys_clock local_88;
  Timestamp local_80 [3];
  undefined1 local_21;
  long local_10;
  
  local_10 = in_RSI;
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  local_21 = 0;
  AixLog::operator<<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  AixLog::Tag::Tag((Tag *)0x214cb9);
  AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)in_stack_fffffffffffffbf8);
  local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_80,&local_88);
  AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  os = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)in_stack_fffffffffffffc00);
  timestamp = (Timestamp *)local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
             (allocator<char> *)in_stack_fffffffffffffc00);
  AixLog::Function::Function
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(string *)in_stack_fffffffffffffbd0
             ,(size_t)in_stack_fffffffffffffbc8);
  AixLog::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  poVar2 = prelude::operator<<((ostream *)in_stack_fffffffffffffbd0,
                               &in_stack_fffffffffffffbc8->super_Displayable);
  std::operator<<(poVar2," <- ");
  AixLog::Function::~Function(in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string((string *)(local_129 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  AixLog::Timestamp::~Timestamp(local_80);
  AixLog::Tag::~Tag((Tag *)0x214e54);
  local_138 = local_10 + 0x28;
  local_140._M_current =
       (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                          (in_stack_fffffffffffffbc8);
  local_148 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                                 ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                  in_stack_fffffffffffffbc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                        *)in_stack_fffffffffffffbd0,
                       (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                        *)in_stack_fffffffffffffbc8);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                ::operator*(&local_140);
    local_151 = 0;
    this_00 = (Codegen *)AixLog::operator<<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    AixLog::Tag::Tag((Tag *)0x214ef8);
    AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)in_stack_fffffffffffffbf8);
    local_1a8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_1a0,&local_1a8);
    tgt = (VarId *)AixLog::operator<<(os,timestamp);
    item = (VarId *)local_221;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    AixLog::Function::Function
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               (string *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
    in_stack_fffffffffffffc10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AixLog::operator<<(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffc08 =
         prelude::operator<<((ostream *)in_stack_fffffffffffffbd0,
                             &in_stack_fffffffffffffbc8->super_Displayable);
    std::operator<<(in_stack_fffffffffffffc08," ");
    AixLog::Function::~Function(in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)(local_221 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_221);
    AixLog::Timestamp::~Timestamp(local_1a0);
    AixLog::Tag::~Tag((Tag *)0x215069);
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    add_collapsed_var(this_00,tgt,item);
    __gnu_cxx::
    __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
    ::operator++(&local_140);
  }
  local_2a8.file._M_string_length._7_1_ = 0;
  AixLog::operator<<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pFVar3 = &local_2a8;
  AixLog::Tag::Tag((Tag *)0x2152c5);
  poVar2 = AixLog::operator<<(in_stack_fffffffffffffc00,(Tag *)pFVar3);
  local_2c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_2c0,&local_2c8);
  AixLog::operator<<(os,timestamp);
  this_01 = (Function *)&local_341;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,(allocator<char> *)poVar2);
  name = (string *)local_369;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,(allocator<char> *)poVar2);
  AixLog::Function::Function
            (this_01,name,(string *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  pFVar3 = (Function *)AixLog::operator<<(poVar2,pFVar3);
  std::ostream::operator<<(pFVar3,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function(pFVar3);
  std::__cxx11::string::~string((string *)(local_369 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  AixLog::Timestamp::~Timestamp(&local_2c0);
  AixLog::Tag::~Tag((Tag *)0x21541d);
  return;
}

Assistant:

void Codegen::deal_phi(mir::inst::PhiInst& phi) {
  auto dest = phi.dest;
  LOG(TRACE) << dest << " <- ";
  for (auto& x : phi.vars) {
    LOG(TRACE) << x << " ";
    add_collapsed_var(dest, x);
    // var_collapse.insert({x, dest});
  }
  LOG(TRACE) << std::endl;
}